

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_bld.cpp
# Opt level: O0

UConverterSharedData * ucnv_load_63(UConverterLoadArgs *pArgs,UErrorCode *err)

{
  UBool UVar1;
  UConverterSharedData *local_28;
  UConverterSharedData *mySharedConverterData;
  UErrorCode *err_local;
  UConverterLoadArgs *pArgs_local;
  
  if ((err == (UErrorCode *)0x0) || (UVar1 = U_FAILURE(*err), UVar1 != '\0')) {
    pArgs_local = (UConverterLoadArgs *)0x0;
  }
  else if ((pArgs->pkg == (char *)0x0) || (*pArgs->pkg == '\0')) {
    local_28 = ucnv_getSharedConverterData(pArgs->name);
    if (local_28 == (UConverterSharedData *)0x0) {
      local_28 = createConverterFromFile(pArgs,err);
      UVar1 = U_FAILURE(*err);
      if ((UVar1 != '\0') || (local_28 == (UConverterSharedData *)0x0)) {
        return (UConverterSharedData *)0x0;
      }
      if (pArgs->onlyTestIsLoadable == '\0') {
        ucnv_shareConverterData(local_28);
      }
    }
    else {
      local_28->referenceCounter = local_28->referenceCounter + 1;
    }
    pArgs_local = (UConverterLoadArgs *)local_28;
  }
  else {
    pArgs_local = (UConverterLoadArgs *)createConverterFromFile(pArgs,err);
  }
  return (UConverterSharedData *)pArgs_local;
}

Assistant:

UConverterSharedData *
ucnv_load(UConverterLoadArgs *pArgs, UErrorCode *err) {
    UConverterSharedData *mySharedConverterData;

    if(err == NULL || U_FAILURE(*err)) {
        return NULL;
    }

    if(pArgs->pkg != NULL && *pArgs->pkg != 0) {
        /* application-provided converters are not currently cached */
        return createConverterFromFile(pArgs, err);
    }

    mySharedConverterData = ucnv_getSharedConverterData(pArgs->name);
    if (mySharedConverterData == NULL)
    {
        /*Not cached, we need to stream it in from file */
        mySharedConverterData = createConverterFromFile(pArgs, err);
        if (U_FAILURE (*err) || (mySharedConverterData == NULL))
        {
            return NULL;
        }
        else if (!pArgs->onlyTestIsLoadable)
        {
            /* share it with other library clients */
            ucnv_shareConverterData(mySharedConverterData);
        }
    }
    else
    {
        /* The data for this converter was already in the cache.            */
        /* Update the reference counter on the shared data: one more client */
        mySharedConverterData->referenceCounter++;
    }

    return mySharedConverterData;
}